

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O1

int AF_AActor_A_ClearLastHeard
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  undefined8 uVar3;
  PClass *pPVar4;
  char *__assertion;
  bool bVar5;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar3 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar3;
        }
        pPVar4 = (PClass *)puVar1[1];
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar5) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar5 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar5) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003f3717;
        }
      }
      puVar1[0x43] = 0;
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003f3717:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x8d6,
                "int AF_AActor_A_ClearLastHeard(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ClearLastHeard)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->LastHeard = NULL;
	return 0;
}